

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnf.cpp
# Opt level: O0

void bal::__statistics_print(void)

{
  ostream *poVar1;
  rep rVar2;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  duration<long,_std::ratio<1L,_1000000000L>_> local_18;
  duration<long,_std::ratio<1L,_1000L>_> local_10;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> duration;
  
  local_20.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_18.__r = (rep)std::chrono::operator-
                                (&local_20,
                                 (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&__time_start_);
  local_10.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_18);
  poVar1 = std::operator<<((ostream *)&std::cout,"Statistics: append: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,__append_clause_);
  poVar1 = std::operator<<(poVar1,", find: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,__find_clause_found);
  poVar1 = std::operator<<(poVar1,"/");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,__find_clause_unfound);
  poVar1 = std::operator<<(poVar1,", compare: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,__compare_clauses_);
  poVar1 = std::operator<<(poVar1,", ");
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_10);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  poVar1 = std::operator<<(poVar1," ms");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void __statistics_print() {
        auto duration = std::chrono::duration_cast<std::chrono::milliseconds>(std::chrono::system_clock::now() - __time_start_);
        std::cout << "Statistics: append: " << __append_clause_ << ", find: " << __find_clause_found << "/" << __find_clause_unfound << ", compare: " << __compare_clauses_ << ", " << duration.count() << " ms" << std::endl;
    }